

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_from_cos
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,batch cos_angle)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined4 in_EAX;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  float in_XMM0_Dc;
  float extraout_XMM0_Dc;
  float in_XMM0_Dd;
  float extraout_XMM0_Dd;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  batch<float,_xsimd::sse4_2> bVar15;
  batch bVar16;
  batch<float,_xsimd::sse4_2> local_18;
  
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = in_XMM0_Dc;
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)cos_angle.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)cos_angle.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = in_XMM0_Dd;
  fVar4 = ctx->cos_start_angle;
  iVar9 = -(uint)(cos_angle.super_simd_register<float,_xsimd::sse4_2>.
                  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>
                  .super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.
                  data[0] < fVar4);
  iVar11 = -(uint)(cos_angle.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data[1] < fVar4);
  auVar14._4_4_ = iVar11;
  auVar14._0_4_ = iVar9;
  auVar14._8_4_ = -(uint)(in_XMM0_Dc < fVar4);
  auVar14._12_4_ = -(uint)(in_XMM0_Dd < fVar4);
  iVar8 = movmskps(in_EAX,auVar14);
  if (iVar8 == 0) {
    uVar13 = 0x3f8000003f800000;
  }
  else {
    fVar5 = ctx->cos_end_angle;
    uVar10 = -(uint)(fVar5 < cos_angle.super_simd_register<float,_xsimd::sse4_2>.
                             super_simd_register<float,_xsimd::sse4_1>.
                             super_simd_register<float,_xsimd::ssse3>.
                             super_simd_register<float,_xsimd::sse3>.
                             super_simd_register<float,_xsimd::sse2>.data[0]);
    uVar12 = -(uint)(fVar5 < cos_angle.super_simd_register<float,_xsimd::sse4_2>.
                             super_simd_register<float,_xsimd::sse4_1>.
                             super_simd_register<float,_xsimd::ssse3>.
                             super_simd_register<float,_xsimd::sse3>.
                             super_simd_register<float,_xsimd::sse2>.data[1]);
    auVar2._4_4_ = uVar12;
    auVar2._0_4_ = uVar10;
    auVar2._8_4_ = -(uint)(fVar5 < in_XMM0_Dc);
    auVar2._12_4_ = -(uint)(fVar5 < in_XMM0_Dd);
    iVar8 = movmskps(iVar8,auVar2);
    if (iVar8 == 0) {
      uVar13 = 0;
    }
    else {
      fVar6 = ctx->m;
      bVar15 = xsimd::acos<float,xsimd::sse4_2>(&local_18);
      fVar1 = ctx->c;
      auVar7._4_4_ = iVar11;
      auVar7._0_4_ = iVar9;
      auVar7._8_4_ = -(uint)(in_XMM0_Dc < fVar4);
      auVar7._12_4_ = -(uint)(in_XMM0_Dd < fVar4);
      auVar3._4_4_ = uVar12 & (uint)(fVar1 + bVar15.super_simd_register<float,_xsimd::sse4_2>.
                                             super_simd_register<float,_xsimd::sse4_1>.
                                             super_simd_register<float,_xsimd::ssse3>.
                                             super_simd_register<float,_xsimd::sse3>.
                                             super_simd_register<float,_xsimd::sse2>.data[1] * fVar6
                                    );
      auVar3._0_4_ = uVar10 & (uint)(fVar1 + bVar15.super_simd_register<float,_xsimd::sse4_2>.
                                             super_simd_register<float,_xsimd::sse4_1>.
                                             super_simd_register<float,_xsimd::ssse3>.
                                             super_simd_register<float,_xsimd::sse3>.
                                             super_simd_register<float,_xsimd::sse2>.data[0] * fVar6
                                    );
      auVar3._8_4_ = -(uint)(fVar5 < in_XMM0_Dc) & (uint)(fVar1 + extraout_XMM0_Dc * fVar6);
      auVar3._12_4_ = -(uint)(fVar5 < in_XMM0_Dd) & (uint)(fVar1 + extraout_XMM0_Dd * fVar6);
      auVar14 = blendvps(_DAT_001bac00,auVar3,auVar7);
      uVar13 = auVar14._0_8_;
    }
  }
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)uVar13;
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)((ulong)uVar13 >> 0x20);
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar13;
  bVar16.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)((ulong)uVar13 >> 0x20);
  return (batch)bVar16.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_from_cos(PolarExtentCoreContext &ctx, batch cos_angle) const {
      auto start = cos_angle >= ctx.cos_start_angle;
      auto end = cos_angle <= ctx.cos_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::acos(cos_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }